

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O2

Entry * __thiscall
Lib::
DHMap<Kernel::Clause_*,_Shell::PartialRedundancyHandler::ConstraintIndex_*,_Lib::DefaultHash,_Lib::DefaultHash2>
::findEntryToInsert(DHMap<Kernel::Clause_*,_Shell::PartialRedundancyHandler::ConstraintIndex_*,_Lib::DefaultHash,_Lib::DefaultHash2>
                    *this,Clause **key)

{
  Clause *pCVar1;
  type tVar2;
  Entry *pEVar3;
  ulong uVar4;
  uint uVar5;
  
  ensureExpanded(this);
  tVar2 = DefaultHash::hash<Kernel::Clause>(*key);
  uVar4 = (ulong)tVar2 % (ulong)(uint)this->_capacity;
  pEVar3 = this->_entries + (int)uVar4;
  uVar5 = this->_entries[(int)uVar4].field_0._infoData;
  if ((uVar5 >> 2 == this->_timestamp) && (pEVar3->_key != *key)) {
    (pEVar3->field_0)._infoData = uVar5 | 2;
    pCVar1 = *key;
    if (pCVar1 == (Clause *)0x0) {
      uVar5 = 0;
    }
    else {
      uVar5 = (pCVar1->super_Unit)._number;
    }
    uVar5 = uVar5 % (uint)this->_capacity;
    do {
      uVar4 = (ulong)((int)uVar4 + uVar5 + (uVar5 == 0)) % (ulong)(uint)this->_capacity;
      pEVar3 = this->_entries + (int)uVar4;
      if ((uint)this->_entries[(int)uVar4].field_0._infoData >> 2 != this->_timestamp) {
        return pEVar3;
      }
    } while (pEVar3->_key != pCVar1);
  }
  return pEVar3;
}

Assistant:

Entry* findEntryToInsert(Key const& key)
  {
    ensureExpanded();
    ASS(_capacity>_size+_deleted);

    unsigned h1=Hash1::hash(key);
    int pos=h1%_capacity;
    Entry* res=&_entries[pos];
    if(res->_info.timestamp != _timestamp || res->_key==key) {
      return res;
    }

    //We have a collision...

    //mark the entry where the collision occured
    res->_info.collision=1;

    unsigned h2=Hash2::hash(key)%_capacity;
    if(h2==0) {
      h2=1;
    }
    do {
      pos=(pos+h2)%_capacity;
      res=&_entries[pos];
    } while (res->_info.timestamp == _timestamp && res->_key!=key);
    return res;
  }